

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.hpp
# Opt level: O2

string * __thiscall
njoy::ENDFtk::tree::Tape::content_abi_cxx11_(string *__return_storage_ptr__,Tape *this)

{
  _Base_ptr p_Var1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output_1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_68 [32];
  _Head_base<1UL,_double,_false> local_48;
  _Head_base<0UL,_double,_false> _Stack_40;
  int local_38 [6];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->tpid_).super__Optional_base<njoy::ENDFtk::TapeIdentification,_false,_false>._M_payload.
      super__Optional_payload<njoy::ENDFtk::TapeIdentification,_true,_false,_false>.
      super__Optional_payload_base<njoy::ENDFtk::TapeIdentification>._M_engaged == true) {
    local_68._0_8_ = __return_storage_ptr__;
    TapeIdentification::print<std::back_insert_iterator<std::__cxx11::string>>
              ((TapeIdentification *)this,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68,0,0,0);
  }
  for (p_Var1 = (this->materials_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->materials_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    Material::content_abi_cxx11_((string *)local_68,(Material *)&p_Var1[1]._M_parent);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_68);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    local_48._M_head_impl = 0.0;
    _Stack_40._M_head_impl = 0.0;
    local_68._16_8_ = 0;
    local_68._24_8_ = 0;
    local_68._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68._8_8_ = 0;
    local_38[0] = -1;
    local_38[1] = 0;
    local_38[2] = 0;
    local_70.container = __return_storage_ptr__;
    StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>
              ((StructureDivision *)local_68,&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

auto content() const {

      std::string content;
      if ( this->tpid_ ) {

        auto output = std::back_inserter( content );
        this->tpid_->print( output, 0, 0, 0 );
      }

      for ( const auto& material : this->materials() ) {

        content += material.content();
      }

      if ( content.size() ) {

        auto output = std::back_inserter( content );
        TEND().print( output );
      }

      return content;
    }